

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

int sigfiddle_setnpoints(t_sigfiddle *x,t_floatarg fnpoints)

{
  bool bVar1;
  uint uVar2;
  t_float *ptVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  byte bVar6;
  
  uVar7 = (uint)fnpoints;
  sigfiddle_freebird(x);
  if (uVar7 - 0x2001 < 0xffffe07f) {
    uVar7 = 0x400;
    pd_error((void *)0x0,"fiddle~: npoints out of range; using %d",0x400);
  }
  bVar6 = 0xff;
  bVar5 = 0xff;
  uVar2 = uVar7;
  if (uVar7 != 0) {
    do {
      bVar5 = bVar6 + 1;
      bVar1 = 1 < uVar2;
      uVar2 = (int)uVar2 >> 1;
      bVar6 = bVar5;
    } while (bVar1);
  }
  if (uVar7 != 1 << (bVar5 & 0x1f)) {
    bVar6 = 0xff;
    bVar5 = 0xff;
    if (uVar7 != 0) {
      do {
        bVar5 = bVar6 + 1;
        bVar1 = 1 < uVar7;
        uVar7 = (int)uVar7 >> 1;
        bVar6 = bVar5;
      } while (bVar1);
    }
    uVar7 = 1 << (bVar5 & 0x1f);
    pd_error((void *)0x0,"fiddle~: npoints not a power of 2; using %d",(ulong)uVar7);
  }
  x->x_hop = (int)uVar7 >> 1;
  ptVar3 = (t_float *)getbytes((long)((int)uVar7 >> 1) << 2);
  x->x_inbuf = ptVar3;
  if (ptVar3 != (t_float *)0x0) {
    ptVar3 = (t_float *)getbytes((long)x->x_hop * 8 + 0x50);
    x->x_lastanalysis = ptVar3;
    if (ptVar3 != (t_float *)0x0) {
      ptVar3 = (t_float *)getbytes((long)x->x_hop << 3);
      x->x_spiral = ptVar3;
      if (ptVar3 != (t_float *)0x0) {
        if (0 < (long)x->x_hop) {
          memset(x->x_inbuf,0,(long)x->x_hop << 2);
        }
        if (-0x14 < (int)uVar7) {
          uVar4 = (ulong)(uVar7 + 0x13);
          if ((int)(uVar7 + 0x13) < 1) {
            uVar4 = 0;
          }
          memset(x->x_lastanalysis,0,uVar4 * 4 + 4);
        }
        if (0 < x->x_hop) {
          lVar8 = 0;
          do {
            dVar9 = ((double)(int)lVar8 * 3.14159) / (double)(int)uVar7;
            dVar10 = cos(dVar9);
            x->x_spiral[lVar8 * 2] = (float)dVar10;
            dVar9 = sin(dVar9);
            x->x_spiral[lVar8 * 2 + 1] = -(float)dVar9;
            lVar8 = lVar8 + 1;
          } while (lVar8 < x->x_hop);
        }
        x->x_phase = 0;
        return 1;
      }
    }
  }
  sigfiddle_freebird(x);
  return 0;
}

Assistant:

int sigfiddle_setnpoints(t_sigfiddle *x, t_floatarg fnpoints)
{
    int i, npoints = fnpoints;
    sigfiddle_freebird(x);
    if (npoints < MINPOINTS || npoints > MAXPOINTS)
    {
        pd_error(0, "fiddle~: npoints out of range; using %d",
            npoints = DEFAULTPOINTS);
    }
    if (npoints != (1 << sigfiddle_ilog2(npoints)))
    {
        pd_error(0, "fiddle~: npoints not a power of 2; using %d",
            npoints = (1 << sigfiddle_ilog2(npoints)));
    }
    x->x_hop = npoints >> 1;
    if (!(x->x_inbuf = (t_float *)getbytes(sizeof(t_float) * x->x_hop)))
        goto fail;
    if (!(x->x_lastanalysis = (t_float *)getbytes(
        sizeof(t_float) * (2 * x->x_hop + 4 * FILTSIZE))))
            goto fail;
    if (!(x->x_spiral = (t_float *)getbytes(sizeof(t_float) * 2 * x->x_hop)))
        goto fail;
    for (i = 0; i < x->x_hop; i++)
        x->x_inbuf[i] = 0;
    for (i = 0; i < npoints + 4 * FILTSIZE; i++)
        x->x_lastanalysis[i] = 0;
    for (i = 0; i < x->x_hop; i++)
        x->x_spiral[2*i] =    cos((3.14159*i)/(npoints)),
        x->x_spiral[2*i+1] = -sin((3.14159*i)/(npoints));
    x->x_phase = 0;
    return (1);
fail:
    sigfiddle_freebird(x);
    return (0);
}